

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O3

ggml_backend_buffer_t
ggml_backend_buffer_init
          (ggml_backend_buffer_type_t buft,ggml_backend_buffer_i iface,void *context,size_t size)

{
  ggml_backend_buffer_t pgVar1;
  long lVar2;
  ggml_backend_buffer_i *pgVar3;
  ggml_backend_buffer_t pgVar4;
  byte bVar5;
  
  bVar5 = 0;
  pgVar1 = (ggml_backend_buffer_t)operator_new(0x68);
  pgVar3 = &iface;
  pgVar4 = pgVar1;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pgVar4->iface).free_buffer = pgVar3->free_buffer;
    pgVar3 = (ggml_backend_buffer_i *)((long)pgVar3 + (ulong)bVar5 * -0x10 + 8);
    pgVar4 = (ggml_backend_buffer_t)((long)pgVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  pgVar1->buft = buft;
  pgVar1->context = context;
  pgVar1->size = size;
  pgVar1->usage = GGML_BACKEND_BUFFER_USAGE_ANY;
  return pgVar1;
}

Assistant:

ggml_backend_buffer_t ggml_backend_buffer_init(
               ggml_backend_buffer_type_t buft,
        struct ggml_backend_buffer_i      iface,
               void *                     context,
               size_t                     size) {
    ggml_backend_buffer_t buffer = new ggml_backend_buffer {
        /* .interface = */ iface,
        /* .buft      = */ buft,
        /* .context   = */ context,
        /* .size      = */ size,
        /* .usage     = */ GGML_BACKEND_BUFFER_USAGE_ANY
    };

    return buffer;
}